

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipmerge.c
# Opt level: O0

int confirm_replace(zip_t *za,char *tname,zip_uint64_t it,zip_t *zs,char *sname,zip_uint64_t is)

{
  char *pcVar1;
  FILE *pFVar2;
  int iVar3;
  undefined8 uVar4;
  char *pcVar5;
  int *piVar6;
  undefined1 local_4c8 [8];
  zip_stat ss;
  zip_stat st;
  char line [1024];
  zip_uint64_t is_local;
  char *sname_local;
  zip_t *zs_local;
  zip_uint64_t it_local;
  char *tname_local;
  zip_t *za_local;
  
  if ((confirm & 1U) == 0) {
    if ((confirm & 2U) == 0) {
      iVar3 = zip_stat_index(za,it,8,&ss.flags);
      pFVar2 = _stderr;
      pcVar1 = progname;
      if (iVar3 < 0) {
        uVar4 = zip_strerror(za);
        fprintf(pFVar2,"%s: cannot stat file %lu in \'%s\': %s\n",pcVar1,it,tname,uVar4);
        za_local._4_4_ = -1;
      }
      else {
        iVar3 = zip_stat_index(zs,is,0,local_4c8);
        pFVar2 = _stderr;
        pcVar1 = progname;
        if (iVar3 < 0) {
          uVar4 = zip_strerror(zs);
          fprintf(pFVar2,"%s: cannot stat file %lu in \'%s\': %s\n",pcVar1,is,sname,uVar4);
          za_local._4_4_ = -1;
        }
        else {
          if ((st.index == ss.index) && ((uint)st.mtime == (uint)ss.mtime)) {
            if ((confirm & 0x10U) != 0) {
              return 1;
            }
            if ((confirm & 0x20U) != 0) {
              return 0;
            }
          }
          printf("replace \'%s\' (%lu / %08x) in `%s\'\n   with \'%s\' (%lu / %08x) from `%s\'? ",
                 st.valid,st.index,(ulong)(uint)st.mtime,tname,ss.valid,ss.index,(uint)ss.mtime,
                 sname);
          fflush(_stdout);
          pcVar5 = fgets((char *)&st.flags,0x400,_stdin);
          pFVar2 = _stderr;
          pcVar1 = progname;
          if (pcVar5 == (char *)0x0) {
            piVar6 = __errno_location();
            pcVar5 = strerror(*piVar6);
            fprintf(pFVar2,"%s: read error from stdin: %s\n",pcVar1,pcVar5);
            za_local._4_4_ = -1;
          }
          else {
            iVar3 = tolower((uint)(byte)st.flags);
            if (iVar3 == 0x79) {
              za_local._4_4_ = 1;
            }
            else {
              za_local._4_4_ = 0;
            }
          }
        }
      }
    }
    else {
      za_local._4_4_ = 0;
    }
  }
  else {
    za_local._4_4_ = 1;
  }
  return za_local._4_4_;
}

Assistant:

static int
confirm_replace(zip_t *za, const char *tname, zip_uint64_t it, zip_t *zs, const char *sname, zip_uint64_t is) {
    char line[1024];
    struct zip_stat st, ss;

    if (confirm & CONFIRM_ALL_YES)
	return 1;
    else if (confirm & CONFIRM_ALL_NO)
	return 0;

    if (zip_stat_index(za, it, ZIP_FL_UNCHANGED, &st) < 0) {
	fprintf(stderr, "%s: cannot stat file %" PRIu64 " in '%s': %s\n", progname, it, tname, zip_strerror(za));
	return -1;
    }
    if (zip_stat_index(zs, is, 0, &ss) < 0) {
	fprintf(stderr, "%s: cannot stat file %" PRIu64 " in '%s': %s\n", progname, is, sname, zip_strerror(zs));
	return -1;
    }

    if (st.size == ss.size && st.crc == ss.crc) {
	if (confirm & CONFIRM_SAME_YES)
	    return 1;
	else if (confirm & CONFIRM_SAME_NO)
	    return 0;
    }

    printf("replace '%s' (%" PRIu64 " / %08x) in `%s'\n"
	   "   with '%s' (%" PRIu64 " / %08x) from `%s'? ",
	   st.name, st.size, st.crc, tname, ss.name, ss.size, ss.crc, sname);
    fflush(stdout);

    if (fgets(line, sizeof(line), stdin) == NULL) {
	fprintf(stderr, "%s: read error from stdin: %s\n", progname, strerror(errno));
	return -1;
    }

    if (tolower((unsigned char)line[0]) == 'y')
	return 1;

    return 0;
}